

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var1;
  long lVar2;
  ostream *poVar3;
  char *local_38;
  long local_30;
  char local_28;
  undefined7 uStack_27;
  
  _Var1._M_head_impl =
       (root->comments_).ptr_._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       ._M_head_impl;
  if ((_Var1._M_head_impl !=
       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
        *)0x0) && (*(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x28) != 0)) {
    local_38 = (char *)CONCAT71(local_38._1_7_,0x20);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(this->document_,(char *)&local_38,1)
    ;
    _Var1._M_head_impl =
         (root->comments_).ptr_._M_t.
         super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
         .
         super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
         ._M_head_impl;
    if (_Var1._M_head_impl ==
        (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
         *)0x0) {
      local_38 = &local_28;
      local_30 = 0;
      local_28 = '\0';
    }
    else {
      local_38 = &local_28;
      lVar2 = *(long *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)(_Var1._M_head_impl)->_M_elems + 0x20))->_M_dataplus;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,lVar2,
                 *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x28) + lVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_38,local_30);
    if (local_38 != &local_28) {
      operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
    }
  }
  _Var1._M_head_impl =
       (root->comments_).ptr_._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       ._M_head_impl;
  if ((_Var1._M_head_impl !=
       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
        *)0x0) && (*(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x48) != 0)) {
    writeIndent(this);
    poVar3 = this->document_;
    _Var1._M_head_impl =
         (root->comments_).ptr_._M_t.
         super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
         .
         super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
         ._M_head_impl;
    if (_Var1._M_head_impl ==
        (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
         *)0x0) {
      local_38 = &local_28;
      local_30 = 0;
      local_28 = '\0';
    }
    else {
      local_38 = &local_28;
      lVar2 = *(long *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)(_Var1._M_head_impl)->_M_elems + 0x40))->_M_dataplus;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,lVar2,
                 *(size_type *)((long)(_Var1._M_head_impl)->_M_elems + 0x48) + lVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_38,local_30);
    if (local_38 != &local_28) {
      operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
    }
  }
  this->field_0x68 = this->field_0x68 & 0xfd;
  return;
}

Assistant:

void StyledStreamWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    *document_ << ' ' << root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *document_ << root.getComment(commentAfter);
  }
  indented_ = false;
}